

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

string * __thiscall
OpenMD::EAMAdapter::getLatticeType_abi_cxx11_(string *__return_storage_ptr__,EAMAdapter *this)

{
  EAMParameters eamParam;
  undefined1 local_40 [48];
  
  getEAMParam((EAMParameters *)local_40,this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string EAMAdapter::getLatticeType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeType;
  }